

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

size_t io::net::read<io::posix::mmap_file,io::net::mutable_buffer,io::net::transfer_all>
                 (undefined8 stream,error_category *buffers)

{
  bool bVar1;
  size_t sVar2;
  system_error *this;
  error_code __ec;
  size_t bytes_read;
  error_code ec;
  mutable_buffer *buffers_local;
  mmap_file *stream_local;
  
  ec._M_cat = buffers;
  std::error_code::error_code((error_code *)&bytes_read);
  sVar2 = read<io::posix::mmap_file,io::net::transfer_all>(stream,ec._M_cat,&bytes_read);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&bytes_read);
  if (!bVar1) {
    return sVar2;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._0_8_ = bytes_read & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(this,__ec,"read");
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t read(SyncReadStream& stream,
                 const MutableBufferSequence& buffers,
                 CompletionCondition completion_condition)
{
    std::error_code ec;
    std::size_t bytes_read = read(stream, buffers, completion_condition, ec);
    if (ec) throw std::system_error(ec, __func__);
    return bytes_read;
}